

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O0

string * anon_unknown.dwarf_e925f::getString(string *filename)

{
  bool bVar1;
  istream *piVar2;
  undefined8 in_RSI;
  string *in_RDI;
  string str;
  ifstream file;
  string local_238 [32];
  long local_218 [67];
  
  std::ifstream::ifstream(local_218,in_RSI,8);
  std::__cxx11::string::string(local_238);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if (bVar1) {
    piVar2 = std::operator>>((istream *)local_218,local_238);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (bVar1) {
      std::__cxx11::string::string((string *)in_RDI,local_238);
      goto LAB_0014d861;
    }
  }
  std::__cxx11::string::string((string *)in_RDI);
LAB_0014d861:
  std::__cxx11::string::~string(local_238);
  std::ifstream::~ifstream(local_218);
  return in_RDI;
}

Assistant:

string getString(const string& filename)
{
  ifstream file(filename);
  string str;

  // Read the first string,
  // stops at any space character
  if (file && (file >> str))
    return str;
  else
    return {};
}